

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelayedObjects.hpp
# Opt level: O1

void __thiscall
gmlc::concurrency::
DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
finishedWithValue(DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *this,int index)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  int iVar3;
  _Base_ptr p_Var4;
  const_iterator __position;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->promiseLock);
  if (iVar3 == 0) {
    p_Var1 = &(this->usedPromiseByInteger)._M_t._M_impl.super__Rb_tree_header;
    p_Var2 = (this->usedPromiseByInteger)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var4 = &p_Var1->_M_header;
    for (; p_Var2 != (_Base_ptr)0x0; p_Var2 = (&p_Var2->_M_left)[(int)p_Var2[1]._M_color < index]) {
      if (index <= (int)p_Var2[1]._M_color) {
        p_Var4 = p_Var2;
      }
    }
    __position._M_node = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var4 != p_Var1) &&
       (__position._M_node = p_Var4, index < (int)p_Var4[1]._M_color)) {
      __position._M_node = &p_Var1->_M_header;
    }
    if ((_Rb_tree_header *)__position._M_node != p_Var1) {
      std::
      _Rb_tree<int,_std::pair<const_int,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_int,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::_M_erase_aux(&(this->usedPromiseByInteger)._M_t,__position);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->promiseLock);
    return;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

void finishedWithValue(int index)
    {
        std::lock_guard<std::mutex> lock(promiseLock);
        auto fnd = usedPromiseByInteger.find(index);
        if (fnd != usedPromiseByInteger.end()) {
            usedPromiseByInteger.erase(fnd);
        }
    }